

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2DataBuilder::setUnicodeVersion(Normalizer2DataBuilder *this,char *v)

{
  int iVar1;
  char local_38 [8];
  char buffer [20];
  undefined1 local_1c [4];
  UVersionInfo version;
  UVersionInfo nullVersion;
  char *v_local;
  Normalizer2DataBuilder *this_local;
  
  _version = v;
  memset(local_1c,0,4);
  u_versionFromString_63((uint8_t *)(buffer + 0x10),_version);
  iVar1 = memcmp(buffer + 0x10,this->unicodeVersion,4);
  if (iVar1 != 0) {
    iVar1 = memcmp(local_1c,this->unicodeVersion,4);
    if (iVar1 != 0) {
      u_versionToString_63(this->unicodeVersion,local_38);
      fprintf(_stderr,"gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
              local_38,_version);
      exit(1);
    }
  }
  *(undefined4 *)this->unicodeVersion = buffer._16_4_;
  return;
}

Assistant:

void
Normalizer2DataBuilder::setUnicodeVersion(const char *v) {
    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    UVersionInfo version;
    u_versionFromString(version, v);
    if( 0!=memcmp(version, unicodeVersion, U_MAX_VERSION_LENGTH) &&
        0!=memcmp(nullVersion, unicodeVersion, U_MAX_VERSION_LENGTH)
    ) {
        char buffer[U_MAX_VERSION_STRING_LENGTH];
        u_versionToString(unicodeVersion, buffer);
        fprintf(stderr, "gennorm2 error: multiple inconsistent Unicode version numbers %s vs. %s\n",
                buffer, v);
        exit(U_ILLEGAL_ARGUMENT_ERROR);
    }
    memcpy(unicodeVersion, version, U_MAX_VERSION_LENGTH);
}